

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnF32ConstExpr
          (BinaryReaderInterp *this,uint32_t value_bits)

{
  bool bVar1;
  Type local_48;
  Location local_40;
  Enum local_20;
  uint32_t local_1c;
  BinaryReaderInterp *pBStack_18;
  uint32_t value_bits_local;
  BinaryReaderInterp *this_local;
  
  local_1c = value_bits;
  pBStack_18 = this;
  GetLocation(&local_40,this);
  Type::Type(&local_48,F32);
  local_20 = (Enum)SharedValidator::OnConst(&this->validator_,&local_40,local_48);
  bVar1 = Failed((Result)local_20);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Istream::Emit(this->istream_,F32Const,local_1c);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnF32ConstExpr(uint32_t value_bits) {
  CHECK_RESULT(validator_.OnConst(GetLocation(), Type::F32));
  istream_.Emit(Opcode::F32Const, value_bits);
  return Result::Ok;
}